

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgTypes.h
# Opt level: O3

void dgSort<dgHullVertex>
               (dgHullVertex *array,HaI32 elements,
               _func_HaI32_dgHullVertex_ptr_dgHullVertex_ptr_void_ptr *compare,void *context)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  HaI32 HVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  dgHullVertex *pdVar10;
  long lVar11;
  uint uVar12;
  dgHullVertex *pdVar13;
  long lVar14;
  dgHullVertex *pdVar15;
  dgHullVertex val;
  dgHullVertex tmp;
  HaI32 stack [1024] [2];
  dgHullVertex local_20b8;
  long local_2090;
  ulong local_2088;
  ulong local_2080;
  ulong local_2078;
  ulong local_2070;
  double local_2068;
  double dStack_2060;
  double dStack_2058;
  double dStack_2050;
  undefined8 local_2048;
  uint auStack_2040 [2052];
  
  uVar9 = 1;
  auStack_2040[2] = 0;
  auStack_2040[3] = elements + -1;
  do {
    lVar11 = (long)(int)uVar9;
    uVar7 = (ulong)((int)uVar9 - 1);
    uVar8 = auStack_2040[lVar11 * 2 + 1];
    uVar12 = auStack_2040[lVar11 * 2];
    if (8 < (int)(uVar8 - uVar12)) {
      local_2090 = lVar11 + -1;
      iVar5 = (int)(uVar8 + uVar12) >> 1;
      local_20b8.m_index = array[iVar5].m_index;
      local_20b8._36_4_ = *(undefined4 *)&array[iVar5].field_0x24;
      pdVar13 = array + iVar5;
      local_20b8.super_dgBigVector.super_dgTemplateVector<double>.m_x =
           (pdVar13->super_dgBigVector).super_dgTemplateVector<double>.m_x;
      local_20b8.super_dgBigVector.super_dgTemplateVector<double>.m_y =
           (pdVar13->super_dgBigVector).super_dgTemplateVector<double>.m_y;
      local_20b8.super_dgBigVector.super_dgTemplateVector<double>.m_z =
           (pdVar13->super_dgBigVector).super_dgTemplateVector<double>.m_z;
      local_20b8.super_dgBigVector.super_dgTemplateVector<double>.m_w =
           (pdVar13->super_dgBigVector).super_dgTemplateVector<double>.m_w;
      local_2088 = uVar9;
      local_2080 = (ulong)uVar8;
      local_2078 = (ulong)uVar12;
      local_2070 = uVar7;
      do {
        lVar11 = (long)(int)uVar12 + -1;
        pdVar13 = array + (int)uVar12;
        uVar4 = uVar12;
        do {
          uVar12 = uVar4;
          pdVar10 = pdVar13;
          HVar6 = (*compare)(pdVar10,&local_20b8,context);
          lVar11 = lVar11 + 1;
          pdVar13 = pdVar10 + 1;
          uVar4 = uVar12 + 1;
        } while (HVar6 < 0);
        lVar14 = (long)(int)uVar8 + 1;
        pdVar13 = array + (int)uVar8;
        uVar4 = uVar8;
        do {
          uVar8 = uVar4;
          pdVar15 = pdVar13;
          HVar6 = (*compare)(pdVar15,&local_20b8,context);
          lVar14 = lVar14 + -1;
          pdVar13 = pdVar15 + -1;
          uVar4 = uVar8 - 1;
        } while (0 < HVar6);
        if (lVar11 <= lVar14) {
          local_2048 = *(undefined8 *)&pdVar10->m_index;
          local_2068 = (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_x;
          dStack_2060 = (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_y;
          dStack_2058 = (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_z;
          dStack_2050 = (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_w;
          pdVar10->m_index = pdVar15->m_index;
          dVar1 = (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_y;
          dVar2 = (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_z;
          dVar3 = (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_w;
          (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_x =
               (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_x;
          (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_y = dVar1;
          (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_z = dVar2;
          (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_w = dVar3;
          pdVar15->m_index = (HaI32)local_2048;
          (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_x = local_2068;
          (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_y = dStack_2060;
          (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_z = dStack_2058;
          (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_w = dStack_2050;
          uVar12 = uVar12 + 1;
          uVar8 = uVar8 - 1;
        }
      } while ((int)uVar12 <= (int)uVar8);
      uVar7 = local_2070;
      if ((int)uVar12 < (int)local_2080) {
        auStack_2040[local_2090 * 2 + 2] = uVar12;
        uVar7 = local_2088;
      }
      if ((int)(uint)local_2078 < (int)uVar8) {
        iVar5 = (int)uVar7;
        auStack_2040[(long)iVar5 * 2 + 2] = (uint)local_2078;
        auStack_2040[(long)iVar5 * 2 + 3] = uVar8;
        uVar7 = (ulong)(iVar5 + 1);
      }
      if (0x3ff < (int)uVar7) {
        __assert_fail("stackIndex < hacd::HaI32 (sizeof (stack) / (2 * sizeof (stack[0][0])))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgTypes.h"
                      ,0x10f,
                      "void dgSort(T *const, hacd::HaI32, hacd::HaI32 (*)(const T *const, const T *const, void *const), void *const) [T = dgHullVertex]"
                     );
      }
    }
    uVar9 = uVar7 & 0xffffffff;
    if ((int)uVar7 == 0) {
      if (1 < elements) {
        lVar11 = 0x28;
        uVar9 = 0x10;
        if ((uint)elements < 0x10) {
          uVar9 = (ulong)(uint)elements;
        }
        do {
          pdVar13 = (dgHullVertex *)
                    ((long)&(array->super_dgBigVector).super_dgTemplateVector<double>.m_x + lVar11);
          HVar6 = (*compare)(array,pdVar13,context);
          if (0 < HVar6) {
            local_20b8.m_index = array->m_index;
            local_20b8._36_4_ = *(undefined4 *)&array->field_0x24;
            local_20b8.super_dgBigVector.super_dgTemplateVector<double>.m_x =
                 (array->super_dgBigVector).super_dgTemplateVector<double>.m_x;
            local_20b8.super_dgBigVector.super_dgTemplateVector<double>.m_y =
                 (array->super_dgBigVector).super_dgTemplateVector<double>.m_y;
            local_20b8.super_dgBigVector.super_dgTemplateVector<double>.m_z =
                 (array->super_dgBigVector).super_dgTemplateVector<double>.m_z;
            local_20b8.super_dgBigVector.super_dgTemplateVector<double>.m_w =
                 (array->super_dgBigVector).super_dgTemplateVector<double>.m_w;
            array->m_index = pdVar13->m_index;
            dVar1 = (pdVar13->super_dgBigVector).super_dgTemplateVector<double>.m_y;
            dVar2 = (pdVar13->super_dgBigVector).super_dgTemplateVector<double>.m_z;
            dVar3 = (pdVar13->super_dgBigVector).super_dgTemplateVector<double>.m_w;
            (array->super_dgBigVector).super_dgTemplateVector<double>.m_x =
                 (pdVar13->super_dgBigVector).super_dgTemplateVector<double>.m_x;
            (array->super_dgBigVector).super_dgTemplateVector<double>.m_y = dVar1;
            (array->super_dgBigVector).super_dgTemplateVector<double>.m_z = dVar2;
            (array->super_dgBigVector).super_dgTemplateVector<double>.m_w = dVar3;
            pdVar13->m_index = local_20b8.m_index;
            (pdVar13->super_dgBigVector).super_dgTemplateVector<double>.m_x =
                 local_20b8.super_dgBigVector.super_dgTemplateVector<double>.m_x;
            (pdVar13->super_dgBigVector).super_dgTemplateVector<double>.m_y =
                 local_20b8.super_dgBigVector.super_dgTemplateVector<double>.m_y;
            (pdVar13->super_dgBigVector).super_dgTemplateVector<double>.m_z =
                 local_20b8.super_dgBigVector.super_dgTemplateVector<double>.m_z;
            (pdVar13->super_dgBigVector).super_dgTemplateVector<double>.m_w =
                 local_20b8.super_dgBigVector.super_dgTemplateVector<double>.m_w;
          }
          lVar11 = lVar11 + 0x28;
        } while (uVar9 * 0x28 != lVar11);
        if (1 < elements) {
          uVar9 = 1;
          lVar11 = 2;
          pdVar13 = array;
          do {
            pdVar13 = pdVar13 + 1;
            pdVar10 = array + (uVar9 - 1);
            local_20b8.m_index = pdVar10[1].m_index;
            local_20b8._36_4_ = *(undefined4 *)&pdVar10[1].field_0x24;
            local_20b8.super_dgBigVector.super_dgTemplateVector<double>.m_x =
                 pdVar10[1].super_dgBigVector.super_dgTemplateVector<double>.m_x;
            local_20b8.super_dgBigVector.super_dgTemplateVector<double>.m_y =
                 pdVar10[1].super_dgBigVector.super_dgTemplateVector<double>.m_y;
            local_20b8.super_dgBigVector.super_dgTemplateVector<double>.m_z =
                 pdVar10[1].super_dgBigVector.super_dgTemplateVector<double>.m_z;
            local_20b8.super_dgBigVector.super_dgTemplateVector<double>.m_w =
                 pdVar10[1].super_dgBigVector.super_dgTemplateVector<double>.m_w;
            HVar6 = (*compare)(pdVar10,&local_20b8,context);
            lVar14 = lVar11;
            pdVar10 = pdVar13;
            if (HVar6 < 1) {
              pdVar15 = array + uVar9;
            }
            else {
              do {
                if (lVar14 + -1 == 0 || lVar14 < 1) {
                  __assert_fail("j > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgTypes.h"
                                ,0x124,
                                "void dgSort(T *const, hacd::HaI32, hacd::HaI32 (*)(const T *const, const T *const, void *const), void *const) [T = dgHullVertex]"
                               );
                }
                pdVar15 = pdVar10 + -1;
                pdVar10->m_index = pdVar10[-1].m_index;
                dVar1 = pdVar10[-1].super_dgBigVector.super_dgTemplateVector<double>.m_y;
                dVar2 = pdVar10[-1].super_dgBigVector.super_dgTemplateVector<double>.m_z;
                dVar3 = pdVar10[-1].super_dgBigVector.super_dgTemplateVector<double>.m_w;
                (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_x =
                     (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_x;
                (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_y = dVar1;
                (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_z = dVar2;
                (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_w = dVar3;
                HVar6 = (*compare)(pdVar10 + -2,&local_20b8,context);
                lVar14 = lVar14 + -1;
                pdVar10 = pdVar15;
              } while (0 < HVar6);
            }
            uVar9 = uVar9 + 1;
            lVar11 = lVar11 + 1;
            pdVar15->m_index = local_20b8.m_index;
            (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_x =
                 local_20b8.super_dgBigVector.super_dgTemplateVector<double>.m_x;
            (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_y =
                 local_20b8.super_dgBigVector.super_dgTemplateVector<double>.m_y;
            (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_z =
                 local_20b8.super_dgBigVector.super_dgTemplateVector<double>.m_z;
            (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_w =
                 local_20b8.super_dgBigVector.super_dgTemplateVector<double>.m_w;
          } while (uVar9 != (uint)elements);
        }
      }
      return;
    }
  } while( true );
}

Assistant:

void dgSort (T* const array, hacd::HaI32 elements, hacd::HaI32 (*compare) (const T* const  A, const T* const B, void* const context), void* const context = NULL)
{
	hacd::HaI32 stride = 8;
	hacd::HaI32 stack[1024][2];

	stack[0][0] = 0;
	stack[0][1] = elements - 1;
	hacd::HaI32 stackIndex = 1;
	while (stackIndex) {
		stackIndex --;
		hacd::HaI32 lo = stack[stackIndex][0];
		hacd::HaI32 hi = stack[stackIndex][1];
		if ((hi - lo) > stride) {
			hacd::HaI32 i = lo;
			hacd::HaI32 j = hi;
			T val (array[(lo + hi) >> 1]);
			do {    
				while (compare (&array[i], &val, context) < 0) i ++;
				while (compare (&array[j], &val, context) > 0) j --;

				if (i <= j)	{
					T tmp (array[i]);
					array[i] = array[j]; 
					array[j] = tmp;
					i++; 
					j--;
				}
			} while (i <= j);

			if (i < hi) {
				stack[stackIndex][0] = i;
				stack[stackIndex][1] = hi;
				stackIndex ++;
			}
			if (lo < j) {
				stack[stackIndex][0] = lo;
				stack[stackIndex][1] = j;
				stackIndex ++;
			}
			HACD_ASSERT (stackIndex < hacd::HaI32 (sizeof (stack) / (2 * sizeof (stack[0][0]))));
		}
	}

	stride = stride * 2;
	if (elements < stride) {
		stride = elements;
	}
	for (hacd::HaI32 i = 1; i < stride; i ++) {
		if (compare (&array[0], &array[i], context) > 0) {
			T tmp (array[0]);
			array[0] = array[i];
			array[i] = tmp;
		}
	}

	for (hacd::HaI32 i = 1; i < elements; i ++) {
		hacd::HaI32 j = i;
		T tmp (array[i]);
		//for (; j && (compare (&array[j - 1], &tmp, context) > 0); j --) {
		for (; compare (&array[j - 1], &tmp, context) > 0; j --) {
			HACD_ASSERT (j > 0);
			array[j] = array[j - 1];
		}
		array[j] = tmp;
	}

#ifdef _DEBUG
	for (hacd::HaI32 i = 0; i < (elements - 1); i ++) {
		HACD_ASSERT (compare (&array[i], &array[i + 1], context) <= 0);
	}
#endif
}